

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int destroy_hashtable(hash_table_t *table)

{
  free(table->table);
  table->table = (hash_entry_t *)0x0;
  table->head = (hash_entry_t *)0x0;
  table->hashfunc = (hash_func_t)0x0;
  table->keycmp = (hash_cmp_t)0x0;
  table->table_size = 0;
  table->entry_count = 0;
  return 0;
}

Assistant:

int destroy_hashtable(hash_table_t *table)
{
   gotcha_free(table->table);
   table->table_size = 0;
   table->entry_count = 0;
   table->hashfunc = NULL;
   table->keycmp = NULL;
   table->table = NULL;
   table->head = NULL;
   return 0;
}